

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vector<float,_4> __thiscall
tcu::swizzleRB<float>(tcu *this,Vector<float,_4> *v,ChannelOrder src,ChannelOrder dst)

{
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar1;
  Vector<float,_4> VVar2;
  ChannelOrder dst_local;
  ChannelOrder src_local;
  Vector<float,_4> *v_local;
  undefined1 auVar3 [12];
  undefined8 uVar4;
  
  if (src == dst) {
    Vector<float,_4>::Vector((Vector<float,_4> *)this,v);
    VVar1.m_data[2] = (float)(int)in_XMM1_Qa;
    VVar1.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
    VVar1.m_data[0] = (float)(int)extraout_XMM0_Qa;
    VVar1.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  }
  else {
    VVar1 = Vector<float,_4>::swizzle((Vector<float,_4> *)this,(int)v,2,1,0);
  }
  VVar2.m_data[0] = VVar1.m_data[0];
  auVar3._4_4_ = VVar1.m_data[1];
  register0x00001240 = VVar1.m_data[2];
  register0x00001244 = VVar1.m_data[3];
  return (Vector<float,_4>)VVar2.m_data;
}

Assistant:

Vector<T, 4> swizzleRB (const Vector<T, 4>& v, TextureFormat::ChannelOrder src, TextureFormat::ChannelOrder dst)
{
	if (src == dst)
		return v;
	else
	{
		DE_ASSERT((src == TextureFormat::RGB && dst == TextureFormat::BGR) ||
				  (src == TextureFormat::BGR && dst == TextureFormat::RGB) ||
				  (src == TextureFormat::RGBA && dst == TextureFormat::BGRA) ||
				  (src == TextureFormat::BGRA && dst == TextureFormat::RGBA));
		return v.swizzle(2,1,0,3);
	}
}